

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.h
# Opt level: O0

void __thiscall
phaeton::IdentifierExpr::IdentifierExpr(IdentifierExpr *this,string *Name,ExprDims *ED)

{
  ExprDims *ED_local;
  string *Name_local;
  IdentifierExpr *this_local;
  
  ExpressionNode::ExpressionNode(&this->super_ExpressionNode,EXPR_KIND_Identifier,0,ED);
  (this->super_ExpressionNode)._vptr_ExpressionNode = (_func_int **)&PTR__IdentifierExpr_001f9b30;
  std::__cxx11::string::string((string *)&this->Name,(string *)Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Indices);
  this->Permute = false;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->IndexPairs);
  this->ElementIndexPosition = -1;
  return;
}

Assistant:

IdentifierExpr(const std::string &Name, const ExprDims &ED)
      : ExpressionNode(EXPR_KIND_Identifier, /*NumChildren=*/0, ED), Name(Name),
        Permute(false), ElementIndexPosition(-1) {}